

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O1

MaterialHandle __thiscall
pbrt::MaterialHandle::Create
          (MaterialHandle *this,string *name,TextureParameterDictionary *parameters,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
          *namedMaterials,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  uintptr_t iptr_1;
  iterator iVar2;
  MixMaterial *pMVar3;
  CoatedDiffuseMaterial *pCVar4;
  CoatedConductorMaterial *pCVar5;
  DielectricMaterial *pDVar6;
  MeasuredMaterial *pMVar7;
  SubsurfaceMaterial *pSVar8;
  FileLoc *pFVar9;
  char *pcVar10;
  long lVar11;
  uintptr_t iptr;
  uintptr_t uVar12;
  ulong uVar13;
  string *name_00;
  long in_FS_OFFSET;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  materials;
  MaterialHandle materialHandles [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  string local_58;
  _Base_ptr local_38;
  
  if ((name->_M_string_length == 0) ||
     (iVar1 = std::__cxx11::string::compare((char *)name), iVar1 == 0)) {
    uVar12 = 0;
    goto LAB_0034d0a3;
  }
  pFVar9 = (FileLoc *)0x287c8e2;
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    pSVar8 = (SubsurfaceMaterial *)DiffuseMaterial::Create(parameters,pFVar9,alloc);
    uVar13 = 0x5000000000000;
    goto LAB_0034d01a;
  }
  pcVar10 = "coateddiffuse";
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    pCVar4 = CoatedDiffuseMaterial::Create(parameters,(FileLoc *)pcVar10,alloc);
    uVar12 = (ulong)pCVar4 | 0x1000000000000;
  }
  else {
    pcVar10 = "coatedconductor";
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      pCVar5 = CoatedConductorMaterial::Create(parameters,(FileLoc *)pcVar10,alloc);
      uVar12 = (ulong)pCVar5 | 0x2000000000000;
    }
    else {
      pcVar10 = "diffusetransmission";
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 == 0) {
        pSVar8 = (SubsurfaceMaterial *)
                 DiffuseTransmissionMaterial::Create(parameters,(FileLoc *)pcVar10,alloc);
        uVar13 = 0x6000000000000;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 == 0) {
          pDVar6 = DielectricMaterial::Create(parameters,loc,alloc);
          uVar12 = (ulong)pDVar6 | 0x4000000000000;
          goto LAB_0034d089;
        }
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 == 0) {
          pSVar8 = (SubsurfaceMaterial *)ThinDielectricMaterial::Create(parameters,loc,alloc);
          uVar13 = 0xa000000000000;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)name);
          if (iVar1 == 0) {
            pSVar8 = (SubsurfaceMaterial *)HairMaterial::Create(parameters,loc,alloc);
            uVar13 = 0x7000000000000;
          }
          else {
            pFVar9 = (FileLoc *)0x287c8f0;
            iVar1 = std::__cxx11::string::compare((char *)name);
            if (iVar1 != 0) {
              pcVar10 = "measured";
              iVar1 = std::__cxx11::string::compare((char *)name);
              if (iVar1 == 0) {
                pMVar7 = MeasuredMaterial::Create(parameters,(FileLoc *)pcVar10,alloc);
                uVar12 = (ulong)pMVar7 | 0x8000000000000;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)name);
                if (iVar1 == 0) {
                  pSVar8 = SubsurfaceMaterial::Create(parameters,loc,alloc);
                  uVar13 = 0x9000000000000;
                  goto LAB_0034d01a;
                }
                iVar1 = std::__cxx11::string::compare((char *)name);
                if (iVar1 != 0) {
                  pcVar10 = "%s: material type unknown.";
                  goto LAB_0034d14b;
                }
                local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"materials","");
                name_00 = &local_58;
                TextureParameterDictionary::GetStringArray(&local_70,parameters,name_00);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  operator_delete(local_58._M_dataplus._M_p,
                                  local_58.field_2._M_allocated_capacity + 1);
                }
                if ((long)local_70.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_70.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start != 0x40) {
                  ErrorExit<>("Must provide two values for \"string materials\" for mix material.");
                }
                local_58._M_dataplus._M_p = (pointer)0x0;
                local_58._M_string_length = 0;
                local_38 = (_Base_ptr)(namedMaterials + 8);
                lVar11 = 0;
                do {
                  iVar2 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
                          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
                                  *)namedMaterials,
                                 (key_type *)
                                 ((long)&((local_70.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar11));
                  if (iVar2._M_node == local_38) {
                    ErrorExit<std::__cxx11::string&>
                              ("%s: named material not found.",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&((local_70.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar11));
                  }
                  (name_00->_M_dataplus)._M_p = *(pointer *)(iVar2._M_node + 2);
                  lVar11 = lVar11 + 0x20;
                  name_00 = (string *)&name_00->_M_string_length;
                } while (lVar11 == 0x20);
                pMVar3 = MixMaterial::Create((MaterialHandle *)&local_58,parameters,loc,alloc);
                uVar12 = (ulong)pMVar3 | 0xb000000000000;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_70);
              }
              goto LAB_0034d089;
            }
            pSVar8 = (SubsurfaceMaterial *)ConductorMaterial::Create(parameters,pFVar9,alloc);
            uVar13 = 0x3000000000000;
          }
        }
      }
LAB_0034d01a:
      uVar12 = uVar13 | (ulong)pSVar8;
    }
  }
LAB_0034d089:
  if ((uVar12 & 0xffffffffffff) == 0) {
    pcVar10 = "%s: unable to create material.";
LAB_0034d14b:
    ErrorExit<std::__cxx11::string_const&>(loc,pcVar10,name);
  }
  TextureParameterDictionary::ReportUnused(parameters);
  *(long *)(in_FS_OFFSET + -0x1e8) = *(long *)(in_FS_OFFSET + -0x1e8) + 1;
LAB_0034d0a3:
  (this->
  super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  ).bits = uVar12;
  return (MaterialHandle)
         (TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
          )this;
}

Assistant:

MaterialHandle MaterialHandle::Create(
    const std::string &name, const TextureParameterDictionary &parameters,
    /*const */ std::map<std::string, MaterialHandle> &namedMaterials, const FileLoc *loc,
    Allocator alloc) {
    MaterialHandle material;
    if (name.empty() || name == "none")
        return nullptr;
    else if (name == "diffuse")
        material = DiffuseMaterial::Create(parameters, loc, alloc);
    else if (name == "coateddiffuse")
        material = CoatedDiffuseMaterial::Create(parameters, loc, alloc);
    else if (name == "coatedconductor")
        material = CoatedConductorMaterial::Create(parameters, loc, alloc);
    else if (name == "diffusetransmission")
        material = DiffuseTransmissionMaterial::Create(parameters, loc, alloc);
    else if (name == "dielectric")
        material = DielectricMaterial::Create(parameters, loc, alloc);
    else if (name == "thindielectric")
        material = ThinDielectricMaterial::Create(parameters, loc, alloc);
    else if (name == "hair")
        material = HairMaterial::Create(parameters, loc, alloc);
    else if (name == "conductor")
        material = ConductorMaterial::Create(parameters, loc, alloc);
    else if (name == "measured")
        material = MeasuredMaterial::Create(parameters, loc, alloc);
    else if (name == "subsurface")
        material = SubsurfaceMaterial::Create(parameters, loc, alloc);
    else if (name == "mix") {
        std::vector<std::string> materials = parameters.GetStringArray("materials");
        if (materials.size() != 2)
            ErrorExit(
                "Must provide two values for \"string materials\" for mix material.");

        MaterialHandle materialHandles[2];
        for (int i = 0; i < 2; ++i) {
            auto iter = namedMaterials.find(materials[i]);
            if (iter == namedMaterials.end())
                ErrorExit("%s: named material not found.", materials[i]);
            materialHandles[i] = iter->second;
        }
        material = MixMaterial::Create(materialHandles, parameters, loc, alloc);
    } else
        ErrorExit(loc, "%s: material type unknown.", name);

    if (!material)
        ErrorExit(loc, "%s: unable to create material.", name);

    parameters.ReportUnused();
    ++nMaterialsCreated;
    return material;
}